

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void tinygltf::SerializeGltfImage(Image *image,json *o)

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  json *local_18;
  json *o_local;
  Image *image_local;
  
  local_18 = o;
  o_local = (json *)image;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"uri",&local_99);
    SerializeStringProperty(&local_98,(string *)&o_local[7].m_value,local_18);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"mimeType",&local_39);
    SerializeStringProperty(&local_38,(string *)&o_local[5].m_value,local_18);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"bufferView",&local_71);
    SerializeNumberProperty<int>(&local_70,*(int *)(o_local + 5),local_18);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c0,"name",&local_c1);
    SerializeStringProperty(&local_c0,(string *)o_local,local_18);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  cVar1 = Value::Type((Value *)&o_local[9].m_value);
  if (cVar1 != '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e8,"extras",&local_e9);
    SerializeValue(&local_e8,(Value *)&o_local[9].m_value,local_18);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  SerializeExtensionMap((ExtensionMap *)(o_local + 0x13),local_18);
  return;
}

Assistant:

static void SerializeGltfImage(Image &image, json &o) {
  // if uri empty, the mimeType and bufferview should be set
  if (image.uri.empty()) {
    SerializeStringProperty("mimeType", image.mimeType, o);
    SerializeNumberProperty<int>("bufferView", image.bufferView, o);
  } else {
    SerializeStringProperty("uri", image.uri, o);
  }

  if (image.name.size()) {
    SerializeStringProperty("name", image.name, o);
  }

  if (image.extras.Type() != NULL_TYPE) {
    SerializeValue("extras", image.extras, o);
  }

  SerializeExtensionMap(image.extensions, o);
}